

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O1

void snapshot_before_block_reuse_test(bool inmem)

{
  undefined1 auVar1 [16];
  fdb_status s;
  fdb_status fVar2;
  sb_decision_t sVar3;
  int iVar4;
  fdb_status fVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_handle *pfVar11;
  char cVar12;
  ulong uVar13;
  char *pcVar14;
  fdb_config *pfVar15;
  char *pcVar16;
  fdb_doc **doc;
  uint uVar17;
  uint uVar18;
  size_t unaff_RBP;
  size_t sVar19;
  fdb_kvs_handle *pfVar20;
  fdb_kvs_handle **ptr_handle;
  undefined7 in_register_00000039;
  fdb_kvs_handle *unaff_R12;
  uint uVar21;
  ulong unaff_R13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle;
  fdb_config *pfVar22;
  char *pcVar23;
  char *pcVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar25;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar26;
  char *unaff_R15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  void *rvalue;
  size_t rvalue_len;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  char bodybuf [256];
  fdb_kvs_handle *pfStackY_27a8;
  fdb_file_handle *pfStackY_27a0;
  fdb_kvs_config fStackY_2798;
  char acStackY_2780 [264];
  fdb_config fStackY_2678;
  char acStackY_2580 [520];
  fdb_doc **ppfStackY_2378;
  size_t sStackY_2368;
  char *pcStackY_2360;
  char *pcStackY_2358;
  code *pcStackY_2350;
  fdb_kvs_handle *pfStack_2340;
  fdb_file_handle *pfStack_2338;
  fdb_iterator *pfStack_2330;
  fdb_doc *pfStack_2328;
  fdb_kvs_handle *pfStack_2320;
  timeval tStack_2318;
  char acStack_2308 [512];
  fdb_kvs_config fStack_2108;
  fdb_file_info fStack_20f0;
  char acStack_20a8 [256];
  fdb_config fStack_1fa8;
  char *pcStack_1eb0;
  fdb_kvs_handle *pfStack_1ea8;
  fdb_kvs_handle *pfStack_1ea0;
  fdb_kvs_handle *pfStack_1e98;
  fdb_kvs_handle *pfStack_1e90;
  fdb_kvs_handle *pfStack_1e88;
  fdb_kvs_handle *pfStack_1e78;
  fdb_file_handle *pfStack_1e70;
  uint uStack_1e64;
  fdb_kvs_info fStack_1e60;
  timeval tStack_1e30;
  fdb_kvs_config fStack_1e20;
  undefined1 auStack_1e08 [80];
  docio_handle *pdStack_1db8;
  btreeblk_handle *pbStack_1db0;
  btree_blk_ops *pbStack_1da8;
  filemgr_ops *pfStack_1da0;
  fdb_config fStack_1d98;
  undefined1 uStack_1bc1;
  fdb_kvs_handle fStack_1bc0;
  fdb_kvs_handle *pfStack_19b8;
  char *pcStack_19b0;
  char *pcStack_19a8;
  fdb_kvs_handle *pfStack_19a0;
  fdb_kvs_handle *pfStack_1998;
  fdb_file_handle *pfStack_1990;
  timeval tStack_1988;
  undefined1 auStack_1978 [536];
  undefined1 auStack_1760 [375];
  undefined1 uStack_15e9;
  fdb_kvs_handle *pfStack_1560;
  undefined8 uStack_1548;
  fdb_kvs_handle *pfStack_1520;
  fdb_kvs_handle *pfStack_1518;
  fdb_kvs_handle *pfStack_1510;
  fdb_kvs_handle *pfStack_1508;
  fdb_kvs_handle *pfStack_1500;
  code *pcStack_14f8;
  fdb_kvs_handle *pfStack_14f0;
  fdb_file_handle *pfStack_14e8;
  fdb_kvs_handle *pfStack_14e0;
  fdb_kvs_handle *pfStack_14d8;
  fdb_kvs_config fStack_14d0;
  timeval tStack_14b8;
  fdb_file_info fStack_14a8;
  fdb_kvs_info fStack_1460;
  undefined1 auStack_1430 [512];
  fdb_kvs_handle fStack_1230;
  size_t sStack_1028;
  char *pcStack_1020;
  char *pcStack_1018;
  code *pcStack_1010;
  fdb_kvs_handle *pfStack_1008;
  fdb_file_handle *pfStack_1000;
  fdb_kvs_info fStack_ff8;
  timeval tStack_fc8;
  fdb_kvs_config fStack_fb8;
  fdb_file_info fStack_fa0;
  char acStack_f58 [256];
  char acStack_e58 [511];
  undefined1 uStack_c59;
  fdb_config fStack_a58;
  char *pcStack_960;
  fdb_config *pfStack_958;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_950;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_948;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_940;
  code *pcStack_938;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_930;
  fdb_file_handle *pfStack_928;
  size_t sStack_920;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_918;
  kvs_info *pkStack_910;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_908;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_900;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8f8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8f0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8e8;
  timeval tStack_8e0;
  undefined1 auStack_8d0 [24];
  fdb_file_info fStack_8b8;
  fdb_config fStack_870;
  fdb_config fStack_770;
  fdb_config *pfStack_678;
  fdb_kvs_handle *pfStack_670;
  ulong uStack_668;
  fdb_config *pfStack_660;
  fdb_file_info *pfStack_658;
  code *pcStack_650;
  fdb_kvs_handle *pfStack_648;
  fdb_file_handle *pfStack_640;
  fdb_kvs_handle *pfStack_638;
  fdb_config *pfStack_630;
  size_t sStack_628;
  fdb_kvs_config fStack_620;
  timeval tStack_608;
  fdb_file_info fStack_5f8;
  fdb_config fStack_5b0;
  fdb_config *pfStack_4b8;
  fdb_kvs_handle *pfStack_4b0;
  fdb_config *pfStack_4a8;
  fdb_file_info *pfStack_4a0;
  code *pcStack_498;
  fdb_kvs_handle *pfStack_490;
  fdb_file_handle *pfStack_488;
  fdb_kvs_handle *pfStack_480;
  fdb_kvs_config fStack_478;
  undefined1 auStack_460 [40];
  fdb_file_info fStack_438;
  fdb_config fStack_3f0;
  ulong uStack_2f8;
  fdb_kvs_handle *pfStack_2f0;
  ulong uStack_2e8;
  fdb_config *pfStack_2e0;
  fdb_file_info *pfStack_2d8;
  code *pcStack_2d0;
  fdb_kvs_handle *local_2c8;
  fdb_file_handle *local_2c0;
  fdb_kvs_handle *local_2b8;
  fdb_config *local_2b0;
  size_t local_2a8;
  fdb_kvs_config local_2a0;
  timeval local_288;
  undefined1 local_278 [280];
  uint8_t local_160 [40];
  char local_138 [264];
  
  uVar13 = CONCAT71(in_register_00000039,inmem) & 0xffffffff;
  pcStack_2d0 = (code *)0x10c05c;
  memleak_start();
  pcStack_2d0 = (code *)0x10c068;
  gettimeofday(&local_288,(__timezone_ptr_t)0x0);
  pfVar22 = (fdb_config *)(local_278 + 0x48);
  pcStack_2d0 = (code *)0x10c078;
  fdb_get_default_config();
  pcStack_2d0 = (code *)0x10c082;
  fdb_get_default_kvs_config();
  pcStack_2d0 = (code *)0x10c08e;
  system("rm -rf  staleblktest* > errorlog.txt");
  local_160[0] = '\x01';
  local_160[1] = '\0';
  local_160[2] = '\0';
  local_160[3] = '\0';
  local_160[4] = '\0';
  local_160[5] = '\0';
  local_160[6] = '\0';
  local_160[7] = '\0';
  pcStack_2d0 = (code *)0x10c0ad;
  fVar2 = fdb_open(&local_2c0,"./staleblktest1",pfVar22);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3b6;
  pcStack_2d0 = (code *)0x10c0c7;
  fVar2 = fdb_kvs_open_default(local_2c0,&local_2c8,&local_2a0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3bd;
  pcStack_2d0 = (code *)0x10c0f1;
  fVar2 = fdb_set_kv(local_2c8,"key",4,"snp",4);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3c4;
  pcStack_2d0 = (code *)0x10c108;
  fVar2 = fdb_commit(local_2c0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3cb;
  ptr_handle = &local_2b8;
  cVar12 = (char)uVar13;
  pfVar20 = local_2c8;
  if (cVar12 == '\0') {
LAB_0010c134:
    pcStack_2d0 = (code *)0x10c13e;
    fVar2 = fdb_snapshot_open(pfVar20,ptr_handle,1);
    pcVar23 = (char *)pfVar22;
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c146;
    goto LAB_0010c40e;
  }
  pcStack_2d0 = (code *)0x10c129;
  fVar2 = fdb_snapshot_open(local_2c8,ptr_handle,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pfVar20 = (fdb_kvs_handle *)(ulong)(uint)fVar2;
    pcStack_2d0 = (code *)0x10c134;
    snapshot_before_block_reuse_test();
    goto LAB_0010c134;
  }
LAB_0010c146:
  unaff_RBP = 0;
  unaff_R12 = (fdb_kvs_handle *)local_278;
  do {
    pcStack_2d0 = (code *)0x10c175;
    fVar2 = fdb_set_kv(local_2c8,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a1;
    pcStack_2d0 = (code *)0x10c18a;
    fVar2 = fdb_get_file_info(local_2c0,(fdb_file_info *)unaff_R12);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c39a;
    uVar17 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar17;
  } while ((ulong)local_278._40_8_ < (fdb_file_handle *)0x1000001);
  unaff_R12 = (fdb_kvs_handle *)0x0;
  pfVar22 = (fdb_config *)0x148599;
  unaff_R15 = "val";
  do {
    unaff_R13 = (ulong)uVar17;
    do {
      pcStack_2d0 = (code *)0x10c1cd;
      fVar2 = fdb_set_kv(local_2c8,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_2d0 = (code *)0x10c39a;
        snapshot_before_block_reuse_test();
        goto LAB_0010c39a;
      }
      uVar21 = (int)unaff_R13 - 1;
      unaff_R13 = (ulong)uVar21;
    } while (uVar21 != 0);
    pcStack_2d0 = (code *)0x10c1e9;
    fVar2 = fdb_commit(local_2c0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a8;
    uVar21 = (int)unaff_R12 + 1;
    unaff_R12 = (fdb_kvs_handle *)(ulong)uVar21;
  } while (uVar21 != 5);
  pcStack_2d0 = (code *)0x10c203;
  sVar3 = sb_check_block_reusing(local_2c8);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010c3d2;
  pcStack_2d0 = (code *)0x10c22c;
  fVar2 = fdb_get_kv(local_2b8,"key",4,&local_2b0,&local_2a8);
  pcVar23 = (char *)local_2b0;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3d7;
  pcStack_2d0 = (code *)0x10c24d;
  iVar4 = bcmp(local_2b0,"snp",local_2a8);
  if (iVar4 != 0) goto LAB_0010c3de;
  pcStack_2d0 = (code *)0x10c25f;
  fVar2 = fdb_kvs_close(local_2b8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3e6;
  pcVar23 = "key";
  unaff_R15 = "val";
  do {
    pcStack_2d0 = (code *)0x10c28f;
    fVar2 = fdb_set_kv(local_2c8,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3af;
    uVar17 = (int)unaff_RBP - 1;
    unaff_RBP = (size_t)uVar17;
  } while (uVar17 != 0);
  pcStack_2d0 = (code *)0x10c2aa;
  fVar2 = fdb_commit(local_2c0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3ed;
  pcStack_2d0 = (code *)0x10c2c5;
  fVar2 = fdb_snapshot_open(local_2c8,&local_2b8,1);
  if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c2df:
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c3f4;
    pcStack_2d0 = (code *)0x10c2f2;
    fVar2 = fdb_free_block(local_2b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3f9;
    pcStack_2d0 = (code *)0x10c303;
    fVar2 = fdb_kvs_close(local_2c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c400;
    pcStack_2d0 = (code *)0x10c315;
    fVar2 = fdb_close(local_2c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_2d0 = (code *)0x10c322;
      fdb_shutdown();
      pcStack_2d0 = (code *)0x10c327;
      memleak_end();
      pcVar23 = "disk snapshot";
      if (cVar12 != '\0') {
        pcVar23 = "in-mem snapshot";
      }
      pcStack_2d0 = (code *)0x10c354;
      sprintf(local_138,"snapshot before block reuse test %s",pcVar23);
      pcVar23 = "%s PASSED\n";
      if (snapshot_before_block_reuse_test(bool)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pcStack_2d0 = (code *)0x10c381;
      fprintf(_stderr,pcVar23,local_138);
      return;
    }
    goto LAB_0010c407;
  }
  pcStack_2d0 = (code *)0x10c2d3;
  fVar5 = fdb_kvs_close(local_2b8);
  fVar2 = FDB_RESULT_SUCCESS;
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010c2df;
  goto LAB_0010c415;
LAB_0010c39a:
  pcStack_2d0 = (code *)0x10c3a1;
  snapshot_before_block_reuse_test();
LAB_0010c3a1:
  pcStack_2d0 = (code *)0x10c3a8;
  snapshot_before_block_reuse_test();
LAB_0010c3a8:
  pcStack_2d0 = (code *)0x10c3af;
  snapshot_before_block_reuse_test();
LAB_0010c3af:
  unaff_R15 = "val";
  pfVar22 = (fdb_config *)0x148599;
  pcStack_2d0 = (code *)0x10c3b6;
  snapshot_before_block_reuse_test();
LAB_0010c3b6:
  pcStack_2d0 = (code *)0x10c3bd;
  snapshot_before_block_reuse_test();
LAB_0010c3bd:
  pcStack_2d0 = (code *)0x10c3c4;
  snapshot_before_block_reuse_test();
LAB_0010c3c4:
  pcStack_2d0 = (code *)0x10c3cb;
  snapshot_before_block_reuse_test();
LAB_0010c3cb:
  pcStack_2d0 = (code *)0x10c3d2;
  snapshot_before_block_reuse_test();
LAB_0010c3d2:
  pcStack_2d0 = (code *)0x10c3d7;
  snapshot_before_block_reuse_test();
LAB_0010c3d7:
  pcVar23 = (char *)pfVar22;
  pcStack_2d0 = (code *)0x10c3de;
  snapshot_before_block_reuse_test();
LAB_0010c3de:
  pcStack_2d0 = (code *)0x10c3e6;
  snapshot_before_block_reuse_test();
LAB_0010c3e6:
  pcStack_2d0 = (code *)0x10c3ed;
  snapshot_before_block_reuse_test();
LAB_0010c3ed:
  pcStack_2d0 = (code *)0x10c3f4;
  snapshot_before_block_reuse_test();
LAB_0010c3f4:
  pcStack_2d0 = (code *)0x10c3f9;
  snapshot_before_block_reuse_test();
LAB_0010c3f9:
  pcStack_2d0 = (code *)0x10c400;
  snapshot_before_block_reuse_test();
LAB_0010c400:
  pcStack_2d0 = (code *)0x10c407;
  snapshot_before_block_reuse_test();
LAB_0010c407:
  pcStack_2d0 = (code *)0x10c40e;
  snapshot_before_block_reuse_test();
LAB_0010c40e:
  pcStack_2d0 = (code *)0x10c415;
  snapshot_before_block_reuse_test();
LAB_0010c415:
  pcStack_2d0 = snapshot_after_block_reuse_test;
  snapshot_before_block_reuse_test();
  pcStack_498 = (code *)0x10c430;
  uStack_2f8 = uVar13;
  pfStack_2f0 = unaff_R12;
  uStack_2e8 = unaff_R13;
  pfStack_2e0 = (fdb_config *)pcVar23;
  pfStack_2d8 = (fdb_file_info *)unaff_R15;
  pcStack_2d0 = (code *)unaff_RBP;
  memleak_start();
  pcStack_498 = (code *)0x10c43c;
  gettimeofday((timeval *)(auStack_460 + 0x18),(__timezone_ptr_t)0x0);
  pcVar14 = (char *)&fStack_3f0;
  pcStack_498 = (code *)0x10c44c;
  fdb_get_default_config();
  pcStack_498 = (code *)0x10c456;
  fdb_get_default_kvs_config();
  pcStack_498 = (code *)0x10c462;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_3f0.compaction_threshold = '\0';
  fStack_3f0.num_keeping_headers = 5;
  pcStack_498 = (code *)0x10c485;
  fVar2 = fdb_open(&pfStack_488,"./staleblktest1",(fdb_config *)pcVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_498 = (code *)0x10c4a6;
    fVar2 = fdb_kvs_open(pfStack_488,&pfStack_490,"num_keep",&fStack_478);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6c3;
    unaff_R13 = 0;
    pcVar14 = "key";
    pcVar23 = "val";
    unaff_R15 = (char *)&fStack_438;
    do {
      pcStack_498 = (code *)0x10c4de;
      fVar2 = fdb_set_kv(pfStack_490,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c6a7:
        pcStack_498 = (code *)0x10c6ae;
        snapshot_after_block_reuse_test();
        goto LAB_0010c6ae;
      }
      pcStack_498 = (code *)0x10c4f3;
      fVar2 = fdb_get_file_info(pfStack_488,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_498 = (code *)0x10c6a7;
        snapshot_after_block_reuse_test();
        goto LAB_0010c6a7;
      }
      unaff_R13 = unaff_R13 - 1;
    } while (fStack_438.file_size < 0x1000001);
    pcStack_498 = (code *)0x10c51b;
    fVar2 = fdb_commit(pfStack_488,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6ca;
    pcVar14 = "key%d";
    pcVar23 = auStack_460;
    unaff_R15 = "reu";
    unaff_RBP = 0;
    do {
      pcStack_498 = (code *)0x10c547;
      sprintf(pcVar23,"key%d",unaff_RBP);
      unaff_R12 = pfStack_490;
      pcStack_498 = (code *)0x10c553;
      sVar6 = strlen(pcVar23);
      pcStack_498 = (code *)0x10c56a;
      fVar2 = fdb_set_kv(unaff_R12,pcVar23,sVar6,"reu",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b5;
      pcStack_498 = (code *)0x10c581;
      fVar2 = fdb_commit(pfStack_488,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6ae;
      uVar17 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar17;
    } while (uVar17 != 10);
    pcVar14 = "key";
    pcVar23 = "val";
    unaff_RBP = unaff_R13 & 0xffffffff;
    do {
      uVar17 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar17;
      if (uVar17 == 0) goto LAB_0010c5ca;
      pcStack_498 = (code *)0x10c5bf;
      fVar2 = fdb_set_kv(pfStack_490,"key",4,"val",4);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    pcStack_498 = (code *)0x10c5ca;
    snapshot_after_block_reuse_test();
LAB_0010c5ca:
    pcStack_498 = (code *)0x10c5d9;
    fVar2 = fdb_commit(pfStack_488,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d1;
    pcStack_498 = (code *)0x10c5f7;
    fVar2 = fdb_snapshot_open(pfStack_490,&pfStack_480,6 - unaff_R13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d8;
    pcStack_498 = (code *)0x10c609;
    fVar2 = fdb_kvs_close(pfStack_480);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6df;
    pcStack_498 = (code *)0x10c627;
    fVar2 = fdb_snapshot_open(pfStack_490,&pfStack_480,5 - unaff_R13);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c6e6;
    pcStack_498 = (code *)0x10c639;
    fVar2 = fdb_kvs_close(pfStack_490);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6eb;
    pcStack_498 = (code *)0x10c64b;
    fVar2 = fdb_close(pfStack_488);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_498 = (code *)0x10c658;
      fdb_shutdown();
      pcStack_498 = (code *)0x10c65d;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pcStack_498 = (code *)0x10c68e;
      fprintf(_stderr,pcVar23,"snapshot after block reuse test");
      return;
    }
  }
  else {
LAB_0010c6bc:
    pcStack_498 = (code *)0x10c6c3;
    snapshot_after_block_reuse_test();
LAB_0010c6c3:
    pcStack_498 = (code *)0x10c6ca;
    snapshot_after_block_reuse_test();
LAB_0010c6ca:
    pcStack_498 = (code *)0x10c6d1;
    snapshot_after_block_reuse_test();
LAB_0010c6d1:
    pcStack_498 = (code *)0x10c6d8;
    snapshot_after_block_reuse_test();
LAB_0010c6d8:
    pcStack_498 = (code *)0x10c6df;
    snapshot_after_block_reuse_test();
LAB_0010c6df:
    pcStack_498 = (code *)0x10c6e6;
    snapshot_after_block_reuse_test();
LAB_0010c6e6:
    pcStack_498 = (code *)0x10c6eb;
    snapshot_after_block_reuse_test();
LAB_0010c6eb:
    pcStack_498 = (code *)0x10c6f2;
    snapshot_after_block_reuse_test();
  }
  pcStack_498 = snapshot_inmem_before_block_reuse_test;
  snapshot_after_block_reuse_test();
  pcStack_650 = (code *)0x10c70d;
  pfStack_4b8 = (fdb_config *)pcVar14;
  pfStack_4b0 = unaff_R12;
  pfStack_4a8 = (fdb_config *)pcVar23;
  pfStack_4a0 = (fdb_file_info *)unaff_R15;
  pcStack_498 = (code *)unaff_RBP;
  memleak_start();
  pcStack_650 = (code *)0x10c719;
  gettimeofday(&tStack_608,(__timezone_ptr_t)0x0);
  pfVar22 = &fStack_5b0;
  pcStack_650 = (code *)0x10c729;
  fdb_get_default_config();
  pcStack_650 = (code *)0x10c733;
  fdb_get_default_kvs_config();
  pcStack_650 = (code *)0x10c73f;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_5b0.num_keeping_headers = 1;
  pcStack_650 = (code *)0x10c75e;
  fVar2 = fdb_open(&pfStack_640,"./staleblktest1",pfVar22);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_650 = (code *)0x10c778;
    fVar2 = fdb_kvs_open_default(pfStack_640,&pfStack_648,&fStack_620);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca2a;
    pcStack_650 = (code *)0x10c7a2;
    fVar2 = fdb_set_kv(pfStack_648,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca31;
    pcStack_650 = (code *)0x10c7b9;
    fVar2 = fdb_commit(pfStack_640,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca38;
    pcStack_650 = (code *)0x10c7d6;
    fVar2 = fdb_snapshot_open(pfStack_648,&pfStack_638,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca3f;
    unaff_RBP = 0;
    unaff_R15 = (char *)&fStack_5f8;
    do {
      pcStack_650 = (code *)0x10c80d;
      fVar2 = fdb_set_kv(pfStack_648,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca0e;
      pcStack_650 = (code *)0x10c822;
      fVar2 = fdb_get_file_info(pfStack_640,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca07;
      uVar17 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar17;
    } while (fStack_5f8.file_size < 0x1000001);
    unaff_R15 = (char *)0x0;
    pfVar22 = (fdb_config *)0x148599;
    pcVar23 = "val";
    do {
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar17;
      do {
        pcStack_650 = (code *)0x10c865;
        fVar2 = fdb_set_kv(pfStack_648,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_650 = (code *)0x10ca07;
          snapshot_inmem_before_block_reuse_test();
          goto LAB_0010ca07;
        }
        uVar21 = (int)unaff_R12 - 1;
        unaff_R12 = (fdb_kvs_handle *)(ulong)uVar21;
      } while (uVar21 != 0);
      pcStack_650 = (code *)0x10c881;
      fVar2 = fdb_commit(pfStack_640,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca15;
      uVar21 = (int)unaff_R15 + 1;
      unaff_R15 = (char *)(ulong)uVar21;
    } while (uVar21 != 5);
    pcStack_650 = (code *)0x10c89b;
    sVar3 = sb_check_block_reusing(pfStack_648);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010ca46;
    pcStack_650 = (code *)0x10c8c4;
    fVar2 = fdb_get_kv(pfStack_638,"key",4,&pfStack_630,&sStack_628);
    pfVar15 = pfStack_630;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca4b;
    pcStack_650 = (code *)0x10c8e5;
    iVar4 = bcmp(pfStack_630,"snp",sStack_628);
    if (iVar4 != 0) goto LAB_0010ca52;
    pcStack_650 = (code *)0x10c8f7;
    fVar2 = fdb_kvs_close(pfStack_638);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca5a;
    pfVar15 = (fdb_config *)0x148599;
    pcVar23 = "val";
    do {
      pcStack_650 = (code *)0x10c927;
      fVar2 = fdb_set_kv(pfStack_648,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca1c;
      uVar17 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar17;
    } while (uVar17 != 0);
    pcStack_650 = (code *)0x10c942;
    fVar2 = fdb_commit(pfStack_640,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca61;
    pcStack_650 = (code *)0x10c95d;
    fVar2 = fdb_snapshot_open(pfStack_648,&pfStack_638,1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c977:
      if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010ca68;
      pcStack_650 = (code *)0x10c98a;
      fVar2 = fdb_free_block(pfStack_630);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca6d;
      pcStack_650 = (code *)0x10c99b;
      fVar2 = fdb_kvs_close(pfStack_648);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca74;
      pcStack_650 = (code *)0x10c9ad;
      fVar2 = fdb_close(pfStack_640);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_650 = (code *)0x10c9ba;
        fdb_shutdown();
        pcStack_650 = (code *)0x10c9bf;
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (snapshot_inmem_before_block_reuse_test()::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pcStack_650 = (code *)0x10c9f0;
        fprintf(_stderr,pcVar23,"snapshot inmem before block reuse test");
        return;
      }
      goto LAB_0010ca7b;
    }
    pcStack_650 = (code *)0x10c96b;
    fVar5 = fdb_kvs_close(pfStack_638);
    fVar2 = FDB_RESULT_SUCCESS;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010c977;
  }
  else {
LAB_0010ca23:
    pcStack_650 = (code *)0x10ca2a;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca2a:
    pcStack_650 = (code *)0x10ca31;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca31:
    pcStack_650 = (code *)0x10ca38;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca38:
    pcStack_650 = (code *)0x10ca3f;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca3f:
    pcStack_650 = (code *)0x10ca46;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca46:
    pcStack_650 = (code *)0x10ca4b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca4b:
    pfVar15 = pfVar22;
    pcStack_650 = (code *)0x10ca52;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca52:
    pcStack_650 = (code *)0x10ca5a;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca5a:
    pcStack_650 = (code *)0x10ca61;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca61:
    pcStack_650 = (code *)0x10ca68;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca68:
    pcStack_650 = (code *)0x10ca6d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca6d:
    pcStack_650 = (code *)0x10ca74;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca74:
    pcStack_650 = (code *)0x10ca7b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca7b:
    pcStack_650 = (code *)0x10ca82;
    snapshot_inmem_before_block_reuse_test();
  }
  pcStack_650 = variable_value_size_test;
  snapshot_inmem_before_block_reuse_test();
  aVar25.seqtree = (btree *)0x0;
  pcStack_938 = (code *)0x10caa7;
  pfStack_678 = pfVar15;
  pfStack_670 = unaff_R12;
  uStack_668 = unaff_R13;
  pfStack_660 = (fdb_config *)pcVar23;
  pfStack_658 = (fdb_file_info *)unaff_R15;
  pcStack_650 = (code *)unaff_RBP;
  gettimeofday(&tStack_8e0,(__timezone_ptr_t)0x0);
  pcStack_938 = (code *)0x10caac;
  memleak_start();
  pcStack_938 = (code *)0x10cab6;
  pcVar14 = (char *)operator_new__(0x500000);
  pcVar23 = auStack_8d0;
  pcStack_938 = (code *)0x10cac6;
  fdb_get_default_kvs_config();
  pfVar22 = &fStack_770;
  pcStack_938 = (code *)0x10cad6;
  fdb_get_default_config();
  fStack_770.compaction_threshold = '\0';
  fStack_770.block_reusing_threshold = 0x41;
  pcStack_938 = (code *)0x10caf4;
  system("rm -rf  staleblktest* > errorlog.txt");
  handle.seqtree = (btree *)&pfStack_928;
  pcStack_938 = (code *)0x10cb0b;
  fdb_open((fdb_file_handle **)handle.seqtree,"./staleblktest1",pfVar22);
  pcStack_938 = (code *)0x10cb1a;
  fdb_kvs_open_default(pfStack_928,(fdb_kvs_handle **)&aStack_930.seqtree,(fdb_kvs_config *)pcVar23)
  ;
  if (fStack_770.num_keeping_headers != 0xffffffffffffffff) {
    pcVar24 = "%d_key";
    pcVar23 = (char *)&fStack_870;
    aVar25.seqtree = (btree *)0x0;
    iVar4 = 0;
    do {
      sStack_920 = CONCAT44(sStack_920._4_4_,iVar4 + 3);
      pfVar22 = (fdb_config *)0x1ff;
      aStack_918 = aVar25;
      do {
        pcStack_938 = (code *)0x10cb60;
        sprintf(pcVar23,"%d_key",(ulong)((int)pfVar22 + 1));
        pcStack_938 = (code *)0x10cb70;
        memset(pcVar14,0x61,(size_t)pfVar22);
        handle = aStack_930;
        pcVar14[(long)pfVar22] = '\0';
        pcStack_938 = (code *)0x10cb81;
        sVar6 = strlen(pcVar23);
        unaff_RBP = sVar6 + 1;
        pcStack_938 = (code *)0x10cb8d;
        sVar6 = strlen(pcVar14);
        pcStack_938 = (code *)0x10cba2;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pcVar23,unaff_RBP,pcVar14,sVar6 + 1);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d083;
        pfVar22 = (fdb_config *)&pfVar22[2].wal_threshold;
      } while (pfVar22 != (fdb_config *)0x7ff);
      pcStack_938 = (code *)0x10cbc9;
      fVar2 = fdb_commit(pfStack_928,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d091;
      aVar25.seqtree = (btree *)&(aStack_918.seqtree)->vsize;
      iVar4 = (int)sStack_920;
    } while (aVar25.seqtree < (undefined1 *)(fStack_770.num_keeping_headers + 1));
    aVar25 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(long)(int)sStack_920;
  }
  pcStack_938 = (code *)0x10cc05;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_930.seqtree,
                            (fdb_kvs_handle **)&aStack_8f8.seqtree,(fdb_seqnum_t)aVar25);
  sVar19 = unaff_RBP;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    sVar7 = 0xffffffff;
    pcVar23 = "%d_key";
    pfVar22 = &fStack_870;
    handle.seqtree = (btree *)0x0;
LAB_0010cc24:
    unaff_RBP = 0x3ff;
    sStack_920 = sVar7;
    aStack_918 = handle;
LAB_0010cc33:
    pcStack_938 = (code *)0x10cc43;
    sprintf((char *)pfVar22,"%d_key",(ulong)((int)unaff_RBP + 1));
    pcStack_938 = (code *)0x10cc53;
    memset(pcVar14,0x62,unaff_RBP);
    handle = aStack_930;
    pcVar14[unaff_RBP] = '\0';
    pcStack_938 = (code *)0x10cc63;
    sVar6 = strlen((char *)pfVar22);
    pcVar24 = (char *)(sVar6 + 1);
    pcStack_938 = (code *)0x10cc6f;
    sVar6 = strlen(pcVar14);
    pcStack_938 = (code *)0x10cc84;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pfVar22,(size_t)pcVar24,pcVar14,sVar6 + 1);
    if (fVar2 == FDB_RESULT_SUCCESS) goto code_r0x0010cc8c;
    pcStack_938 = (code *)0x10d083;
    variable_value_size_test();
LAB_0010d083:
    pcStack_938 = (code *)0x10d08a;
    variable_value_size_test();
    goto LAB_0010d08a;
  }
LAB_0010d0a6:
  pcStack_938 = (code *)0x10d0ad;
  variable_value_size_test();
LAB_0010d0ad:
  pcStack_938 = (code *)0x10d0b2;
  variable_value_size_test();
LAB_0010d0b2:
  pcStack_938 = (code *)0x10d0b9;
  variable_value_size_test();
LAB_0010d0b9:
  pcStack_938 = (code *)0x10d0c0;
  variable_value_size_test();
LAB_0010d0c0:
  pcStack_938 = (code *)0x10d0c7;
  variable_value_size_test();
LAB_0010d0c7:
  pcStack_938 = (code *)0x10d0ce;
  variable_value_size_test();
LAB_0010d0ce:
  pcStack_938 = (code *)0x10d0d5;
  variable_value_size_test();
LAB_0010d0d5:
  aVar26 = aVar25;
  pcStack_938 = (code *)0x10d0dc;
  variable_value_size_test();
LAB_0010d0dc:
  pcStack_938 = (code *)0x10d0e4;
  variable_value_size_test();
LAB_0010d0e4:
  pcStack_938 = (code *)0x10d0eb;
  variable_value_size_test();
LAB_0010d0eb:
  pcStack_938 = (code *)0x10d0f2;
  variable_value_size_test();
LAB_0010d0f2:
  pcStack_938 = (code *)0x10d0fa;
  variable_value_size_test();
LAB_0010d0fa:
  pcStack_938 = (code *)0x10d101;
  variable_value_size_test();
LAB_0010d101:
  pcStack_938 = (code *)0x10d108;
  variable_value_size_test();
LAB_0010d108:
  pcStack_938 = (code *)0x10d10f;
  variable_value_size_test();
LAB_0010d10f:
  pcStack_938 = (code *)0x10d116;
  variable_value_size_test();
LAB_0010d116:
  pcStack_938 = rollback_with_num_keeping_headers;
  variable_value_size_test();
  pcStack_1010 = (code *)0x10d13a;
  pcStack_960 = pcVar14;
  pfStack_958 = pfVar22;
  aStack_950 = handle;
  aStack_948 = aVar26;
  aStack_940 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar23;
  pcStack_938 = (code *)sVar19;
  gettimeofday(&tStack_fc8,(__timezone_ptr_t)0x0);
  pcStack_1010 = (code *)0x10d13f;
  memleak_start();
  pcStack_1010 = (code *)0x10d14c;
  fdb_get_default_kvs_config();
  pcStack_1010 = (code *)0x10d15c;
  fdb_get_default_config();
  fStack_a58.compaction_threshold = '\0';
  fStack_a58.block_reusing_threshold = 0x41;
  fStack_a58.num_keeping_headers = 1;
  pcStack_1010 = (code *)0x10d183;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_1010 = (code *)0x10d19a;
  fdb_open(&pfStack_1000,"./staleblktest1",&fStack_a58);
  pcStack_1010 = (code *)0x10d1a8;
  fdb_kvs_open_default(pfStack_1000,&pfStack_1008,&fStack_fb8);
  pcVar16 = "%dkey";
  pcVar14 = acStack_f58;
  pcVar24 = acStack_e58;
  pcVar23 = (char *)0x0;
  do {
    pcStack_1010 = (code *)0x10d1d0;
    sprintf(pcVar14,"%dkey",pcVar23);
    pcStack_1010 = (code *)0x10d1e2;
    memset(pcVar24,0x62,0x1ff);
    pfVar20 = pfStack_1008;
    uStack_c59 = 0;
    pcStack_1010 = (code *)0x10d1f6;
    sVar8 = strlen(pcVar14);
    pcStack_1010 = (code *)0x10d201;
    sVar6 = strlen(pcVar24);
    pcStack_1010 = (code *)0x10d215;
    fVar2 = fdb_set_kv(pfVar20,pcVar14,sVar8,pcVar24,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d465:
      pcStack_1010 = (code *)0x10d46c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d46c;
    }
    pcStack_1010 = (code *)0x10d22c;
    fVar2 = fdb_commit(pfStack_1000,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1010 = (code *)0x10d465;
      rollback_with_num_keeping_headers();
      goto LAB_0010d465;
    }
    uVar17 = (int)pcVar23 + 1;
    pcVar23 = (char *)(ulong)uVar17;
  } while (uVar17 != 10);
  pcVar24 = (char *)0x0;
  pcVar23 = acStack_f58;
  pcVar14 = acStack_e58;
  pcVar16 = (char *)0x0;
  do {
    pfVar20 = pfStack_1008;
    builtin_strncpy(acStack_f58,"0key",5);
    builtin_strncpy(acStack_e58,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_1010 = (code *)0x10d2be;
    sVar8 = strlen(pcVar23);
    pcStack_1010 = (code *)0x10d2c9;
    sVar6 = strlen(pcVar14);
    pcStack_1010 = (code *)0x10d2dd;
    fVar2 = fdb_set_kv(pfVar20,pcVar23,sVar8,pcVar14,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d473;
    pcStack_1010 = (code *)0x10d2f4;
    fVar2 = fdb_get_file_info(pfStack_1000,&fStack_fa0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d46c;
    uVar17 = (int)pcVar16 + 1;
    pcVar16 = (char *)(ulong)uVar17;
  } while (fStack_fa0.file_size < 0x1000000);
  pcStack_1010 = (code *)0x10d319;
  sVar3 = sb_check_block_reusing(pfStack_1008);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_1010 = (code *)0x10d331;
    fVar2 = fdb_commit(pfStack_1000,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d486;
    pcVar14 = acStack_f58;
    pcVar24 = acStack_e58;
    pcVar23 = (char *)0x0;
    do {
      pcStack_1010 = (code *)0x10d35e;
      sprintf(pcVar14,"%dkey",pcVar23);
      pcStack_1010 = (code *)0x10d370;
      memset(pcVar24,100,0x1ff);
      pfVar20 = pfStack_1008;
      uStack_c59 = 0;
      pcStack_1010 = (code *)0x10d384;
      sVar8 = strlen(pcVar14);
      pcStack_1010 = (code *)0x10d38f;
      sVar6 = strlen(pcVar24);
      pcStack_1010 = (code *)0x10d3a3;
      fVar2 = fdb_set_kv(pfVar20,pcVar14,sVar8,pcVar24,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d47a;
      uVar21 = (int)pcVar23 + 1;
      pcVar23 = (char *)(ulong)uVar21;
    } while (uVar17 != uVar21);
    pcStack_1010 = (code *)0x10d3be;
    fVar2 = fdb_rollback(&pfStack_1008,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d48d;
    pcStack_1010 = (code *)0x10d3d4;
    fVar2 = fdb_get_kvs_info(pfStack_1008,&fStack_ff8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d494;
    if (fStack_ff8.doc_count != 10) {
      pcStack_1010 = (code *)0x10d3ee;
      rollback_with_num_keeping_headers();
    }
    pcStack_1010 = (code *)0x10d3f7;
    fVar2 = fdb_kvs_close(pfStack_1008);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d49b;
    pcStack_1010 = (code *)0x10d409;
    fVar2 = fdb_close(pfStack_1000);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1010 = (code *)0x10d416;
      fdb_shutdown();
      pcStack_1010 = (code *)0x10d41b;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pcStack_1010 = (code *)0x10d44c;
      fprintf(_stderr,pcVar23,"rollback with num keeping headers");
      return;
    }
  }
  else {
LAB_0010d481:
    pcStack_1010 = (code *)0x10d486;
    rollback_with_num_keeping_headers();
LAB_0010d486:
    pcStack_1010 = (code *)0x10d48d;
    rollback_with_num_keeping_headers();
LAB_0010d48d:
    pcStack_1010 = (code *)0x10d494;
    rollback_with_num_keeping_headers();
LAB_0010d494:
    pcStack_1010 = (code *)0x10d49b;
    rollback_with_num_keeping_headers();
LAB_0010d49b:
    pcStack_1010 = (code *)0x10d4a2;
    rollback_with_num_keeping_headers();
  }
  pcStack_1010 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_14f8 = (code *)0x10d4c6;
  fStack_1230.bub_ctx.space_used = (uint64_t)pcVar16;
  sStack_1028 = sVar8;
  pcStack_1020 = pcVar14;
  pcStack_1018 = pcVar24;
  pcStack_1010 = (code *)pcVar23;
  gettimeofday(&tStack_14b8,(__timezone_ptr_t)0x0);
  pcStack_14f8 = (code *)0x10d4cb;
  memleak_start();
  pcStack_14f8 = (code *)0x10d4d8;
  fdb_get_default_kvs_config();
  pcStack_14f8 = (code *)0x10d4e8;
  fdb_get_default_config();
  fStack_1230.config.block_reusing_threshold._7_1_ = 0;
  fStack_1230.max_seqnum = 0x41;
  fStack_1230.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1230.dirty_updates = '\0';
  fStack_1230._466_6_ = 0;
  pcStack_14f8 = (code *)0x10d50f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_14f8 = (code *)0x10d526;
  fdb_open(&pfStack_14e8,"./staleblktest1file.1",(fdb_config *)&fStack_1230.config.encryption_key);
  pcStack_14f8 = (code *)0x10d53b;
  fdb_kvs_open(pfStack_14e8,&pfStack_14f0,"./staleblktest1",&fStack_14d0);
  pcVar14 = "%dkey";
  pfVar20 = &fStack_1230;
  pfVar11 = (fdb_kvs_handle *)auStack_1430;
  pcVar23 = (char *)0x0;
  do {
    pcStack_14f8 = (code *)0x10d563;
    sprintf((char *)pfVar20,"%dkey",pcVar23);
    pcStack_14f8 = (code *)0x10d575;
    memset(pfVar11,0x62,0x1ff);
    pfVar10 = pfStack_14f0;
    auStack_1430[0x1ff] = 0;
    pcStack_14f8 = (code *)0x10d589;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar20);
    pcStack_14f8 = (code *)0x10d594;
    sVar6 = strlen((char *)pfVar11);
    pcStack_14f8 = (code *)0x10d5a8;
    fVar2 = fdb_set_kv(pfVar10,pfVar20,(size_t)pfVar9,pfVar11,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010da08:
      pcStack_14f8 = (code *)0x10da0f;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da0f;
    }
    pcStack_14f8 = (code *)0x10d5bf;
    fVar2 = fdb_commit(pfStack_14e8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_14f8 = (code *)0x10da08;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da08;
    }
    uVar17 = (int)pcVar23 + 1;
    pcVar23 = (char *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pfVar11 = (fdb_kvs_handle *)0x0;
  pcVar14 = (char *)&fStack_1230;
  pcVar23 = auStack_1430;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfVar10 = pfStack_14f0;
    fStack_1230.kvs_config._4_1_ = 0;
    fStack_1230.kvs_config.create_if_missing = true;
    fStack_1230.kvs_config._1_3_ = 0x79656b;
    auStack_1430._0_8_ = 0x6363636363636363;
    auStack_1430._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1430._16_8_ = (void *)0x6363636363636363;
    auStack_1430._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1430._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1430._40_7_ = 0x63636363636363;
    auStack_1430[0x2f] = 99;
    auStack_1430._48_7_ = 0x63636363636363;
    auStack_1430[0x37] = 99;
    auStack_1430._56_7_ = 0x63636363636363;
    auStack_1430[0x3f] = 99;
    auStack_1430._64_8_ = (btree *)0x6363636363636363;
    auStack_1430._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1430._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1430._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1430._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1430._104_7_ = 0x63636363636363;
    auStack_1430[0x6f] = 99;
    auStack_1430._112_7_ = 0x63636363636363;
    auStack_1430._119_8_ = 0x6363636363636363;
    auStack_1430[0x7f] = 0;
    pcStack_14f8 = (code *)0x10d652;
    pfVar9 = (fdb_kvs_handle *)strlen(pcVar14);
    pcStack_14f8 = (code *)0x10d65d;
    sVar6 = strlen(pcVar23);
    pcStack_14f8 = (code *)0x10d671;
    fVar2 = fdb_set_kv(pfVar10,pcVar14,(size_t)pfVar9,pcVar23,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da16;
    pcStack_14f8 = (code *)0x10d688;
    fVar2 = fdb_get_file_info(pfStack_14e8,&fStack_14a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da0f;
    pfVar20 = (fdb_kvs_handle *)(ulong)((int)pfVar20 + 1);
  } while (fStack_14a8.file_size < 0x1000000);
  pcStack_14f8 = (code *)0x10d6ab;
  sVar3 = sb_check_block_reusing(pfStack_14f0);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_14f8 = (code *)0x10d6c3;
    fVar2 = fdb_commit(pfStack_14e8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da45;
    pcStack_14f8 = (code *)0x10d6dc;
    fVar2 = fdb_get_kvs_info(pfStack_14f0,&fStack_1460);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da4c;
    pfStack_14e0 = (fdb_kvs_handle *)fStack_1460.last_seqnum;
    pfVar11 = &fStack_1230;
    pfVar10 = (fdb_kvs_handle *)auStack_1430;
    pcVar23 = (char *)0x0;
    do {
      pcStack_14f8 = (code *)0x10d716;
      sprintf((char *)pfVar11,"%dkey",pcVar23);
      pfVar9 = pfStack_14f0;
      auStack_1430._0_8_ = 0x6464646464646464;
      auStack_1430._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_1430._16_8_ = (void *)0x6464646464646464;
      auStack_1430._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_1430._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_1430._40_7_ = 0x64646464646464;
      auStack_1430[0x2f] = 100;
      auStack_1430._48_7_ = 0x64646464646464;
      auStack_1430[0x37] = 100;
      auStack_1430._56_7_ = 0x64646464646464;
      auStack_1430[0x3f] = 0;
      pcStack_14f8 = (code *)0x10d751;
      pcVar14 = (char *)strlen((char *)pfVar11);
      pcStack_14f8 = (code *)0x10d75c;
      sVar6 = strlen((char *)pfVar10);
      pcStack_14f8 = (code *)0x10d770;
      fVar2 = fdb_set_kv(pfVar9,pfVar11,(size_t)pcVar14,pfVar10,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da24;
      pcStack_14f8 = (code *)0x10d787;
      fVar2 = fdb_commit(pfStack_14e8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da1d;
      uVar17 = (int)pcVar23 + 1;
      pcVar23 = (char *)(ulong)uVar17;
    } while (uVar17 != 10);
    pcStack_14f8 = (code *)0x10d7a3;
    fVar2 = fdb_kvs_close(pfStack_14f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da53;
    pcStack_14f8 = (code *)0x10d7b5;
    fVar2 = fdb_close(pfStack_14e8);
    pcVar14 = (char *)pfStack_14e0;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da5a;
    pcStack_14f8 = (code *)0x10d7c7;
    fdb_shutdown();
    pcStack_14f8 = (code *)0x10d7e0;
    fVar2 = fdb_open(&pfStack_14e8,"./staleblktest1file.1",
                     (fdb_config *)&fStack_1230.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da61;
    pcStack_14f8 = (code *)0x10d801;
    fdb_kvs_open(pfStack_14e8,&pfStack_14f0,"./staleblktest1",&fStack_14d0);
    pcStack_14f8 = (code *)0x10d810;
    fVar2 = fdb_get_file_info(pfStack_14e8,&fStack_14a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da68;
    pcStack_14f8 = (code *)0x10d838;
    iVar4 = _disk_dump("./staleblktest1file.1",fStack_14a8.file_size,
                       (ulong)(((uint)fStack_1230.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_1230.config.encryption_key.bytes._0_4_ * 2));
    if (iVar4 < 0) goto LAB_0010da6f;
    pcStack_14f8 = (code *)0x10d851;
    fVar2 = fdb_snapshot_open(pfStack_14f0,&pfStack_14d8,(fdb_seqnum_t)pcVar14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da74;
    pcStack_14f8 = (code *)0x10d864;
    fVar2 = fdb_rollback(&pfStack_14f0,(fdb_seqnum_t)pcVar14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da7b;
    pcStack_14f8 = (code *)0x10d87d;
    fVar2 = fdb_compact(pfStack_14e8,"./staleblktest1file.3");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da82;
    pcVar14 = "%dkey";
    pfVar10 = &fStack_1230;
    pcVar23 = (char *)0x0;
    do {
      pcStack_14f8 = (code *)0x10d8a5;
      sprintf((char *)pfVar10,"%dkey",pcVar23);
      pfVar11 = pfStack_14f0;
      pcStack_14f8 = (code *)0x10d8b1;
      sVar6 = strlen((char *)pfVar10);
      pcStack_14f8 = (code *)0x10d8bf;
      fVar2 = fdb_del_kv(pfVar11,pfVar10,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da32;
      pcStack_14f8 = (code *)0x10d8d6;
      fVar2 = fdb_commit(pfStack_14e8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da2b;
      uVar17 = (int)pcVar23 + 1;
      pcVar23 = (char *)(ulong)uVar17;
    } while (uVar17 != 0xb);
    pcStack_14f8 = (code *)0x10d8ee;
    sVar3 = sb_check_block_reusing(pfStack_14f0);
    if (sVar3 != SBD_NONE) goto LAB_0010da89;
    pcVar23 = (char *)0x0;
    pcVar14 = auStack_1430;
    pfVar9 = &fStack_1230;
    do {
      fStack_1230.kvs_config._4_1_ = 0;
      fStack_1230.kvs_config.create_if_missing = true;
      fStack_1230.kvs_config._1_3_ = 0x79656b;
      pcStack_14f8 = (code *)0x10d92d;
      memset(pcVar14,0x65,0x1ff);
      pfVar11 = pfStack_14f0;
      auStack_1430[0x1ff] = 0;
      pcStack_14f8 = (code *)0x10d941;
      pfVar10 = (fdb_kvs_handle *)strlen((char *)pfVar9);
      pcStack_14f8 = (code *)0x10d94c;
      sVar6 = strlen(pcVar14);
      pcStack_14f8 = (code *)0x10d960;
      fVar2 = fdb_set_kv(pfVar11,pfVar9,(size_t)pfVar10,pcVar14,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da39;
      uVar17 = (int)pfVar20 - 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar17;
    } while (uVar17 != 0);
    pcStack_14f8 = (code *)0x10d976;
    sVar3 = sb_check_block_reusing(pfStack_14f0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010da8e;
    pcStack_14f8 = (code *)0x10d989;
    fVar2 = fdb_kvs_close(pfStack_14d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da93;
    pcStack_14f8 = (code *)0x10d99a;
    fVar2 = fdb_kvs_close(pfStack_14f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da9a;
    pcStack_14f8 = (code *)0x10d9ac;
    fVar2 = fdb_close(pfStack_14e8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_14f8 = (code *)0x10d9b9;
      fdb_shutdown();
      pcStack_14f8 = (code *)0x10d9be;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pcStack_14f8 = (code *)0x10d9ef;
      fprintf(_stderr,pcVar23,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da40:
    pcStack_14f8 = (code *)0x10da45;
    crash_and_recover_with_num_keeping_test();
LAB_0010da45:
    pcStack_14f8 = (code *)0x10da4c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4c:
    pcStack_14f8 = (code *)0x10da53;
    crash_and_recover_with_num_keeping_test();
LAB_0010da53:
    pcStack_14f8 = (code *)0x10da5a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5a:
    pcStack_14f8 = (code *)0x10da61;
    crash_and_recover_with_num_keeping_test();
LAB_0010da61:
    pcStack_14f8 = (code *)0x10da68;
    crash_and_recover_with_num_keeping_test();
LAB_0010da68:
    pcStack_14f8 = (code *)0x10da6f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6f:
    pcStack_14f8 = (code *)0x10da74;
    crash_and_recover_with_num_keeping_test();
LAB_0010da74:
    pcStack_14f8 = (code *)0x10da7b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7b:
    pcStack_14f8 = (code *)0x10da82;
    crash_and_recover_with_num_keeping_test();
LAB_0010da82:
    pcStack_14f8 = (code *)0x10da89;
    crash_and_recover_with_num_keeping_test();
LAB_0010da89:
    pcStack_14f8 = (code *)0x10da8e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da8e:
    pcStack_14f8 = (code *)0x10da93;
    crash_and_recover_with_num_keeping_test();
LAB_0010da93:
    pcStack_14f8 = (code *)0x10da9a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da9a:
    pcStack_14f8 = (code *)0x10daa1;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_14f8 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_19a0 = (fdb_kvs_handle *)0x10dac5;
  pfStack_1520 = (fdb_kvs_handle *)pcVar14;
  pfStack_1518 = pfVar10;
  pfStack_1510 = pfVar9;
  pfStack_1508 = pfVar20;
  pfStack_1500 = pfVar11;
  pcStack_14f8 = (code *)pcVar23;
  gettimeofday(&tStack_1988,(__timezone_ptr_t)0x0);
  pfStack_19a0 = (fdb_kvs_handle *)0x10daca;
  memleak_start();
  pfStack_19a0 = (fdb_kvs_handle *)0x10dada;
  fdb_get_default_kvs_config();
  pfStack_19a0 = (fdb_kvs_handle *)0x10daea;
  fdb_get_default_config();
  uStack_15e9 = 0;
  pfStack_1560 = (fdb_kvs_handle *)0x41;
  uStack_1548 = 10;
  pfStack_19a0 = (fdb_kvs_handle *)0x10db11;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_19a0 = (fdb_kvs_handle *)0x10db28;
  fdb_open(&pfStack_1990,"./staleblktest1",(fdb_config *)(auStack_1760 + 0x148));
  pfStack_19a0 = (fdb_kvs_handle *)0x10db36;
  fdb_kvs_open_default(pfStack_1990,&pfStack_1998,(fdb_kvs_config *)(auStack_1978 + 0x200));
  pcVar24 = "%dkey";
  pcVar14 = auStack_1760 + 0x48;
  pcVar23 = auStack_1978;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_19a0 = (fdb_kvs_handle *)0x10db5b;
    sprintf(pcVar14,"%dkey",pfVar20);
    pfStack_19a0 = (fdb_kvs_handle *)0x10db6d;
    memset(pcVar23,0x62,0x1ff);
    pfVar11 = pfStack_1998;
    auStack_1978[0x1ff] = 0;
    pfStack_19a0 = (fdb_kvs_handle *)0x10db81;
    pfVar10 = (fdb_kvs_handle *)strlen(pcVar14);
    pfStack_19a0 = (fdb_kvs_handle *)0x10db8c;
    sVar6 = strlen(pcVar23);
    pfStack_19a0 = (fdb_kvs_handle *)0x10dba0;
    fVar2 = fdb_set_kv(pfVar11,pcVar14,(size_t)pfVar10,pcVar23,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010de39:
      pfStack_19a0 = (fdb_kvs_handle *)0x10de40;
      reuse_on_delete_test();
      goto LAB_0010de40;
    }
    pfStack_19a0 = (fdb_kvs_handle *)0x10dbb7;
    fVar2 = fdb_commit(pfStack_1990,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_19a0 = (fdb_kvs_handle *)0x10de39;
      reuse_on_delete_test();
      goto LAB_0010de39;
    }
    uVar17 = (int)pfVar20 + 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pcVar23 = auStack_1760 + 0x48;
  pfVar11 = (fdb_kvs_handle *)auStack_1978;
  pfVar10 = (fdb_kvs_handle *)auStack_1760;
  pcVar24 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar9 = (fdb_kvs_handle *)pcVar24;
    pfStack_19a0 = (fdb_kvs_handle *)0x10dbf0;
    sprintf(pcVar23,"%dkey",pfVar9);
    pfVar20 = pfStack_1998;
    auStack_1978._0_8_ = 0x6363636363636363;
    auStack_1978._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1978._16_8_ = (void *)0x6363636363636363;
    auStack_1978._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1978._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1978._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_1978._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_1978._56_8_ = (btree *)0x6363636363636363;
    auStack_1978._64_8_ = (btree *)0x6363636363636363;
    auStack_1978._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1978._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1978._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1978._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1978._104_7_ = 0x63636363636363;
    auStack_1978[0x6f] = 99;
    auStack_1978._112_7_ = 0x63636363636363;
    auStack_1978._119_8_ = 0x6363636363636363;
    auStack_1978[0x7f] = 0;
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc39;
    pcVar14 = (char *)strlen(pcVar23);
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc44;
    sVar6 = strlen((char *)pfVar11);
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc58;
    fVar2 = fdb_set_kv(pfVar20,pcVar23,(size_t)pcVar14,pfVar11,sVar6);
    pcVar24 = (char *)pfVar9;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de47;
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc6d;
    fVar2 = fdb_get_file_info(pfStack_1990,(fdb_file_info *)pfVar10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de40;
    uVar17 = (uint)pfVar9 + 1;
    pcVar24 = (char *)(ulong)uVar17;
  } while ((ulong)auStack_1760._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_19a0 = (fdb_kvs_handle *)0x10dc92;
  sVar3 = sb_check_block_reusing(pfStack_1998);
  if (sVar3 == SBD_NONE) {
    pfStack_19a0 = (fdb_kvs_handle *)0x10dca9;
    fVar2 = fdb_commit(pfStack_1990,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de61;
    pcVar14 = "%dkey";
    pcVar23 = auStack_1760 + 0x48;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_19a0 = (fdb_kvs_handle *)0x10dcd5;
      sprintf(pcVar23,"%dkey",pfVar20);
      pfVar11 = pfStack_1998;
      pfStack_19a0 = (fdb_kvs_handle *)0x10dce1;
      sVar6 = strlen(pcVar23);
      pfStack_19a0 = (fdb_kvs_handle *)0x10dcef;
      fVar2 = fdb_del_kv(pfVar11,pcVar23,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de4e;
      uVar21 = (int)pfVar20 + 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar21;
    } while (uVar17 != uVar21);
    pfStack_19a0 = (fdb_kvs_handle *)0x10dd06;
    sVar3 = sb_check_block_reusing(pfStack_1998);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de68;
    if (2 < (uint)pfVar9) {
      pcVar24 = (char *)(ulong)(uVar17 >> 2);
      pcVar23 = auStack_1760 + 0x48;
      pfVar11 = (fdb_kvs_handle *)auStack_1978;
      pfVar20 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_19a0 = (fdb_kvs_handle *)0x10dd3e;
        sprintf(pcVar23,"%dkey",pfVar20);
        pfVar9 = pfStack_1998;
        auStack_1978._0_8_ = 0x6464646464646464;
        auStack_1978._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_1978._16_8_ = (void *)0x6464646464646464;
        auStack_1978._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_1978._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_1978._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_1978._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_1978._56_8_ = (btree *)0x6464646464646464;
        auStack_1978._64_8_ = (btree *)0x6464646464646464;
        auStack_1978._72_8_ = (filemgr *)0x6464646464646464;
        auStack_1978._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_1978._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_1978._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_1978._104_7_ = 0x64646464646464;
        auStack_1978[0x6f] = 100;
        auStack_1978._112_7_ = 0x64646464646464;
        auStack_1978._119_8_ = 0x6464646464646464;
        auStack_1978[0x7f] = 0;
        pfStack_19a0 = (fdb_kvs_handle *)0x10dd87;
        pcVar14 = (char *)strlen(pcVar23);
        pfStack_19a0 = (fdb_kvs_handle *)0x10dd92;
        sVar6 = strlen((char *)pfVar11);
        pfStack_19a0 = (fdb_kvs_handle *)0x10dda6;
        fVar2 = fdb_set_kv(pfVar9,pcVar23,(size_t)pcVar14,pfVar11,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de55;
        uVar21 = (int)pfVar20 + 2;
        pfVar20 = (fdb_kvs_handle *)(ulong)uVar21;
      } while (uVar21 < uVar17 >> 2);
    }
    pcVar23 = auStack_1760 + 0x48;
    pfStack_19a0 = (fdb_kvs_handle *)0x10ddc2;
    sVar3 = sb_check_block_reusing(pfStack_1998);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de6d;
    pfStack_19a0 = (fdb_kvs_handle *)0x10ddd5;
    fVar2 = fdb_close(pfStack_1990);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de72;
    pfStack_19a0 = (fdb_kvs_handle *)0x10dde2;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_19a0 = (fdb_kvs_handle *)0x10ddef;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_19a0 = (fdb_kvs_handle *)0x10de20;
      fprintf(_stderr,pcVar23,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de5c:
    pfStack_19a0 = (fdb_kvs_handle *)0x10de61;
    reuse_on_delete_test();
LAB_0010de61:
    pfVar9 = pfVar10;
    pfStack_19a0 = (fdb_kvs_handle *)0x10de68;
    reuse_on_delete_test();
LAB_0010de68:
    pfStack_19a0 = (fdb_kvs_handle *)0x10de6d;
    reuse_on_delete_test();
LAB_0010de6d:
    pfStack_19a0 = (fdb_kvs_handle *)0x10de72;
    reuse_on_delete_test();
LAB_0010de72:
    pfStack_19a0 = (fdb_kvs_handle *)0x10de79;
    reuse_on_delete_test();
  }
  pfStack_19a0 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_1e88 = (fdb_kvs_handle *)0x10de9d;
  fStack_1bc0.bub_ctx.space_used = (uint64_t)pcVar24;
  fStack_1bc0.bub_ctx.handle = pfVar11;
  pfStack_19b8 = pfVar9;
  pcStack_19b0 = pcVar14;
  pcStack_19a8 = pcVar23;
  pfStack_19a0 = pfVar20;
  gettimeofday(&tStack_1e30,(__timezone_ptr_t)0x0);
  pfStack_1e88 = (fdb_kvs_handle *)0x10dea2;
  memleak_start();
  pfStack_1e88 = (fdb_kvs_handle *)0x10deaf;
  fdb_get_default_kvs_config();
  pfStack_1e88 = (fdb_kvs_handle *)0x10debf;
  fdb_get_default_config();
  fStack_1bc0.config.block_reusing_threshold._7_1_ = 0;
  fStack_1bc0.max_seqnum = 0x23;
  fStack_1bc0.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1bc0.dirty_updates = '\0';
  fStack_1bc0._466_6_ = 0;
  pfStack_1e88 = (fdb_kvs_handle *)0x10dee6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1e88 = (fdb_kvs_handle *)0x10defd;
  fdb_open(&pfStack_1e70,"./staleblktest1",(fdb_config *)&fStack_1bc0.config.encryption_key);
  pfStack_1e88 = (fdb_kvs_handle *)0x10df0d;
  fdb_kvs_open_default(pfStack_1e70,&pfStack_1e78,&fStack_1e20);
  pcVar24 = "%dkey";
  pcVar23 = (char *)&fStack_1bc0;
  pcVar14 = auStack_1e08 + 0x48;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1e88 = (fdb_kvs_handle *)0x10df35;
    sprintf(pcVar23,"%dkey",pfVar20);
    pfStack_1e88 = (fdb_kvs_handle *)0x10df47;
    memset(pcVar14,0x61,0x1ff);
    pfVar10 = pfStack_1e78;
    uStack_1bc1 = 0;
    pfStack_1e88 = (fdb_kvs_handle *)0x10df5c;
    pfVar11 = (fdb_kvs_handle *)strlen(pcVar23);
    pfStack_1e88 = (fdb_kvs_handle *)0x10df67;
    sVar6 = strlen(pcVar14);
    pfStack_1e88 = (fdb_kvs_handle *)0x10df7b;
    fVar2 = fdb_set_kv(pfVar10,pcVar23,(size_t)pfVar11,pcVar14,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010e2e3:
      pfStack_1e88 = (fdb_kvs_handle *)0x10e2ea;
      fragmented_reuse_test();
      goto LAB_0010e2ea;
    }
    pfStack_1e88 = (fdb_kvs_handle *)0x10df92;
    fVar2 = fdb_commit(pfStack_1e70,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e2e3;
      fragmented_reuse_test();
      goto LAB_0010e2e3;
    }
    uVar17 = (int)pfVar20 + 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pcVar14 = (char *)&fStack_1bc0;
  pfVar10 = (fdb_kvs_handle *)(auStack_1e08 + 0x48);
  pfVar11 = (fdb_kvs_handle *)auStack_1e08;
  pcVar24 = (char *)0x0;
  do {
    uVar17 = (uint)pcVar24;
    pfStack_1e88 = (fdb_kvs_handle *)0x10dfcb;
    sprintf(pcVar14,"%dkey",pcVar24);
    pfVar20 = pfStack_1e78;
    auStack_1e08._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_1db8 = (docio_handle *)0x6262626262626262;
    pbStack_1db0 = (btreeblk_handle *)0x6262626262626262;
    pbStack_1da8 = (btree_blk_ops *)0x6262626262626262;
    pfStack_1da0 = (filemgr_ops *)0x6262626262626262;
    fStack_1d98.chunksize = 0x6262;
    fStack_1d98._2_2_ = 0x6262;
    fStack_1d98.blocksize = 0x62626262;
    fStack_1d98.buffercache_size = 0x6262626262626262;
    fStack_1d98.wal_threshold = 0x6262626262626262;
    fStack_1d98.wal_flush_before_commit = true;
    fStack_1d98.auto_commit = true;
    fStack_1d98._26_2_ = 0x6262;
    fStack_1d98.purging_interval = 0x62626262;
    fStack_1d98.seqtree_opt = 'b';
    fStack_1d98.durability_opt = 'b';
    fStack_1d98._34_2_ = 0x6262;
    fStack_1d98.flags = 0x62626262;
    fStack_1d98.compaction_buf_maxsize = 0x62626262;
    fStack_1d98.cleanup_cache_onclose = true;
    fStack_1d98.compress_document_body = true;
    fStack_1d98.compaction_mode = 'b';
    fStack_1d98.compaction_threshold = 'b';
    fStack_1d98.compaction_minimum_filesize = 0x6262626262626262;
    fStack_1d98.compactor_sleep_duration = 0x6262626262626262;
    fStack_1d98.multi_kv_instances = true;
    fStack_1d98._65_6_ = 0x626262626262;
    fStack_1d98._71_1_ = 0x62;
    fStack_1d98.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_1d98._79_8_ = 0x6262626262626262;
    fStack_1d98._87_1_ = 0;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e027;
    pcVar23 = (char *)strlen(pcVar14);
    pfStack_1e88 = (fdb_kvs_handle *)0x10e032;
    sVar6 = strlen((char *)pfVar10);
    pfStack_1e88 = (fdb_kvs_handle *)0x10e046;
    fVar2 = fdb_set_kv(pfVar20,pcVar14,(size_t)pcVar23,pfVar10,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f1;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e05b;
    fVar2 = fdb_get_file_info(pfStack_1e70,(fdb_file_info *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ea;
    uVar21 = uVar17 + 1;
    pcVar24 = (char *)(ulong)uVar21;
  } while ((ulong)auStack_1e08._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_1e64 = uVar17;
  if (2 < uVar17) {
    uVar17 = (uVar21 >> 2) + (uint)(uVar21 >> 2 == 0);
    pfVar11 = (fdb_kvs_handle *)(ulong)uVar17;
    pcVar23 = "%dkey";
    pcVar14 = (char *)&fStack_1bc0;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e0b2;
      sprintf(pcVar14,"%dkey",pfVar20);
      pfVar10 = pfStack_1e78;
      pfStack_1e88 = (fdb_kvs_handle *)0x10e0bf;
      sVar6 = strlen(pcVar14);
      pfStack_1e88 = (fdb_kvs_handle *)0x10e0cd;
      fVar2 = fdb_del_kv(pfVar10,pcVar14,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ff;
      uVar18 = (int)pfVar20 + 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar18;
    } while (uVar17 != uVar18);
  }
  pcVar14 = (char *)&fStack_1bc0;
  pfStack_1e88 = (fdb_kvs_handle *)0x10e0e6;
  sVar3 = sb_check_block_reusing(pfStack_1e78);
  if (sVar3 == SBD_NONE) {
    pcVar14 = (char *)(pfStack_1e78->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e10c;
    fVar2 = fdb_compact(pfStack_1e70,"staleblktest_compact");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e319;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e123;
    fVar2 = fdb_get_kvs_info(pfStack_1e78,&fStack_1e60);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e320;
    if (fStack_1e60.doc_count == 0) {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e13d;
      fragmented_reuse_test();
    }
    pcVar23 = (char *)(ulong)(uVar21 >> 2);
    if (pcVar14 <=
        (fdb_kvs_handle *)(pfStack_1e78->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e163;
      fragmented_reuse_test();
    }
    uVar17 = uVar21 >> 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar17;
    if (uVar21 >> 2 < uVar17) {
      pcVar14 = "%dkey";
      pfVar10 = &fStack_1bc0;
      do {
        pfStack_1e88 = (fdb_kvs_handle *)0x10e18b;
        sprintf((char *)pfVar10,"%dkey",pcVar23);
        pfVar11 = pfStack_1e78;
        pfStack_1e88 = (fdb_kvs_handle *)0x10e198;
        sVar6 = strlen((char *)pfVar10);
        pfStack_1e88 = (fdb_kvs_handle *)0x10e1a6;
        fVar2 = fdb_del_kv(pfVar11,pfVar10,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e306;
        uVar18 = (int)pcVar23 + 1;
        pcVar23 = (char *)(ulong)uVar18;
      } while (uVar18 < uVar17);
    }
    pfStack_1e88 = (fdb_kvs_handle *)0x10e1c0;
    sVar3 = sb_check_block_reusing(pfStack_1e78);
    if (sVar3 != SBD_NONE) goto LAB_0010e327;
    if (uVar17 <= uStack_1e64) {
      pcVar23 = "%dkey";
      pcVar14 = (char *)&fStack_1bc0;
      do {
        pfStack_1e88 = (fdb_kvs_handle *)0x10e1ec;
        sprintf(pcVar14,"%dkey",pfVar20);
        pfVar10 = pfStack_1e78;
        pfStack_1e88 = (fdb_kvs_handle *)0x10e1f9;
        sVar6 = strlen(pcVar14);
        pfStack_1e88 = (fdb_kvs_handle *)0x10e207;
        fVar2 = fdb_del_kv(pfVar10,pcVar14,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e30d;
        uVar17 = (int)pfVar20 + 1;
        pfVar20 = (fdb_kvs_handle *)(ulong)uVar17;
      } while (uVar21 != uVar17);
    }
    pcVar24 = (char *)0xb;
    do {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e229;
      fVar2 = fdb_commit(pfStack_1e70,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f8;
      uVar17 = (int)pcVar24 - 1;
      pcVar24 = (char *)(ulong)uVar17;
    } while (uVar17 != 0);
    pfStack_1e88 = (fdb_kvs_handle *)0x10e244;
    fVar2 = fdb_get_kvs_info(pfStack_1e78,&fStack_1e60);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e32c;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e256;
    sVar3 = sb_check_block_reusing(pfStack_1e78);
    if (sVar3 == SBD_NONE) goto LAB_0010e333;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e26d;
    fVar2 = fdb_commit(pfStack_1e70,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e338;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e27f;
    fVar2 = fdb_close(pfStack_1e70);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e33f;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e28c;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e299;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_1e88 = (fdb_kvs_handle *)0x10e2ca;
      fprintf(_stderr,pcVar23,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e314:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e319;
    fragmented_reuse_test();
LAB_0010e319:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e320;
    fragmented_reuse_test();
LAB_0010e320:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e327;
    fragmented_reuse_test();
LAB_0010e327:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e32c;
    fragmented_reuse_test();
LAB_0010e32c:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e333;
    fragmented_reuse_test();
LAB_0010e333:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e338;
    fragmented_reuse_test();
LAB_0010e338:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e33f;
    fragmented_reuse_test();
LAB_0010e33f:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e346;
    fragmented_reuse_test();
  }
  pfStack_1e88 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_2350 = (code *)0x10e36a;
  pcStack_1eb0 = pcVar24;
  pfStack_1ea8 = pfVar10;
  pfStack_1ea0 = pfVar11;
  pfStack_1e98 = (fdb_kvs_handle *)pcVar23;
  pfStack_1e90 = (fdb_kvs_handle *)pcVar14;
  pfStack_1e88 = pfVar20;
  gettimeofday(&tStack_2318,(__timezone_ptr_t)0x0);
  pcStackY_2350 = (code *)0x10e36f;
  memleak_start();
  pfStack_2328 = (fdb_doc *)0x0;
  pcStackY_2350 = (code *)0x10e388;
  fdb_get_default_kvs_config();
  pcStackY_2350 = (code *)0x10e398;
  fdb_get_default_config();
  fStack_1fa8.compaction_threshold = '\0';
  fStack_1fa8.block_reusing_threshold = 0x23;
  fStack_1fa8.num_keeping_headers = 10;
  pcStackY_2350 = (code *)0x10e3bf;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_2350 = (code *)0x10e3d6;
  fdb_open(&pfStack_2338,"./staleblktest1",&fStack_1fa8);
  pcStackY_2350 = (code *)0x10e3ed;
  fdb_kvs_open(pfStack_2338,&pfStack_2340,"db",&fStack_2108);
  pcStackY_2350 = (code *)0x10e404;
  fdb_kvs_open(pfStack_2338,&pfStack_2320,"db2",&fStack_2108);
  pcVar23 = acStack_20a8;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar14 = acStack_2308;
  pcVar24 = (char *)0x0;
  do {
    pcStackY_2350 = (code *)0x10e430;
    sprintf(pcVar23,"%dkey",pcVar24);
    pfVar20 = pfStack_2340;
    builtin_strncpy(acStack_2308,"aaaaaaaaaaa",0xc);
    pcStackY_2350 = (code *)0x10e44f;
    sVar8 = strlen(pcVar23);
    pcStackY_2350 = (code *)0x10e45a;
    sVar6 = strlen(pcVar14);
    pcStackY_2350 = (code *)0x10e46e;
    fVar2 = fdb_set_kv(pfVar20,pcVar23,sVar8,pcVar14,sVar6);
    pfVar20 = pfStack_2320;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_2350 = (code *)0x10e779;
      enter_reuse_via_separate_kvs_test();
LAB_0010e779:
      pcStackY_2350 = (code *)0x10e780;
      enter_reuse_via_separate_kvs_test();
LAB_0010e780:
      pcStackY_2350 = (code *)0x10e787;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e787;
    }
    pcStackY_2350 = (code *)0x10e483;
    sVar8 = strlen(pcVar23);
    pcStackY_2350 = (code *)0x10e48e;
    sVar6 = strlen(pcVar14);
    pcStackY_2350 = (code *)0x10e4a2;
    fVar2 = fdb_set_kv(pfVar20,pcVar23,sVar8,pcVar14,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e779;
    pcStackY_2350 = (code *)0x10e4b9;
    fVar2 = fdb_commit(pfStack_2338,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e780;
    uVar17 = (int)pcVar24 + 1;
    pcVar24 = (char *)(ulong)uVar17;
  } while (uVar17 != 10);
  pcVar14 = (char *)0x0;
  pcVar24 = acStack_20a8;
  pcVar23 = acStack_2308;
  doc = (fdb_doc **)0x0;
  do {
    pfVar20 = pfStack_2340;
    builtin_strncpy(acStack_20a8,"0key",5);
    builtin_strncpy(acStack_2308,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_2350 = (code *)0x10e541;
    sVar8 = strlen(pcVar24);
    pcStackY_2350 = (code *)0x10e54c;
    sVar6 = strlen(pcVar23);
    pcStackY_2350 = (code *)0x10e560;
    fVar2 = fdb_set_kv(pfVar20,pcVar24,sVar8,pcVar23,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78e;
    pcStackY_2350 = (code *)0x10e57a;
    fVar2 = fdb_get_file_info(pfStack_2338,&fStack_20f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e787;
    uVar17 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar17;
  } while (fStack_20f0.file_size < 0x1000000);
  pcStackY_2350 = (code *)0x10e5a0;
  sVar3 = sb_check_block_reusing(pfStack_2340);
  if (sVar3 == SBD_RECLAIM) {
    pcStackY_2350 = (code *)0x10e5b8;
    fVar2 = fdb_commit(pfStack_2338,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7a6;
    pcVar23 = acStack_20a8;
    pcVar14 = acStack_2308;
    pcVar24 = (char *)0x0;
    do {
      pcStackY_2350 = (code *)0x10e5e2;
      sprintf(pcVar23,"key%d",pcVar24);
      pfVar20 = pfStack_2340;
      builtin_strncpy(acStack_2308,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_2350 = (code *)0x10e632;
      sVar8 = strlen(pcVar23);
      pcStackY_2350 = (code *)0x10e63d;
      sVar6 = strlen(pcVar14);
      pcStackY_2350 = (code *)0x10e651;
      fVar2 = fdb_set_kv(pfVar20,pcVar23,sVar8,pcVar14,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e795;
      uVar21 = (int)pcVar24 + 1;
      pcVar24 = (char *)(ulong)uVar21;
    } while (uVar17 != uVar21);
    pcStackY_2350 = (code *)0x10e672;
    fVar2 = fdb_commit(pfStack_2338,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7ad;
    pcStackY_2350 = (code *)0x10e69a;
    fdb_iterator_init(pfStack_2320,&pfStack_2330,(void *)0x0,0,(void *)0x0,0,0);
    pcVar24 = (char *)0xa;
    doc = &pfStack_2328;
    do {
      pcStackY_2350 = (code *)0x10e6b1;
      fVar2 = fdb_iterator_get(pfStack_2330,doc);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e79c;
      pcStackY_2350 = (code *)0x10e6c3;
      fdb_doc_free(pfStack_2328);
      pfStack_2328 = (fdb_doc *)0x0;
      pcStackY_2350 = (code *)0x10e6d6;
      fVar2 = fdb_iterator_next(pfStack_2330);
      uVar17 = (int)pcVar24 - 1;
      pcVar24 = (char *)(ulong)uVar17;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar17 != 0) goto LAB_0010e7b4;
    pcStackY_2350 = (code *)0x10e6ef;
    fdb_iterator_close(pfStack_2330);
    pcStackY_2350 = (code *)0x10e6f9;
    fVar2 = fdb_kvs_close(pfStack_2340);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7b9;
    pcStackY_2350 = (code *)0x10e70b;
    fVar2 = fdb_kvs_close(pfStack_2320);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_2350 = (code *)0x10e71d;
      fVar2 = fdb_close(pfStack_2338);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStackY_2350 = (code *)0x10e72a;
        fdb_shutdown();
        pcStackY_2350 = (code *)0x10e72f;
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pcStackY_2350 = (code *)0x10e760;
        fprintf(_stderr,pcVar23,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7c7;
    }
  }
  else {
LAB_0010e7a1:
    pcStackY_2350 = (code *)0x10e7a6;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7a6:
    pcStackY_2350 = (code *)0x10e7ad;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7ad:
    pcStackY_2350 = (code *)0x10e7b4;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b4:
    pcStackY_2350 = (code *)0x10e7b9;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b9:
    pcStackY_2350 = (code *)0x10e7c0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_2350 = (code *)0x10e7c7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7c7:
  pcStackY_2350 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_2378 = doc;
  sStackY_2368 = sVar8;
  pcStackY_2360 = pcVar23;
  pcStackY_2358 = pcVar14;
  pcStackY_2350 = (code *)pcVar24;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_2678.block_reusing_threshold = 0x41;
  fStackY_2678.num_keeping_headers = 5;
  fdb_open(&pfStackY_27a0,"./staleblktest1",&fStackY_2678);
  fdb_kvs_open(pfStackY_27a0,&pfStackY_27a8,"db",&fStackY_2798);
  iVar4 = 0;
  uVar13 = 0;
  do {
    sprintf(acStackY_2780,"key%d",uVar13);
    sprintf(acStackY_2580,"seqno%d",uVar13);
    pfVar20 = pfStackY_27a8;
    sVar6 = strlen(acStackY_2780);
    sVar8 = strlen(acStackY_2580);
    fdb_set_kv(pfVar20,acStackY_2780,sVar6,acStackY_2580,sVar8);
    if ((int)(uVar13 / 100) * 100 + iVar4 == 0) {
      fdb_commit(pfStackY_27a0,(int)(uVar13 / 500) * 500 + iVar4 == 0);
    }
    uVar13 = (ulong)((int)uVar13 + 1);
    iVar4 = iVar4 + -1;
  } while( true );
LAB_0010c6ae:
  pcStack_498 = (code *)0x10c6b5;
  snapshot_after_block_reuse_test();
LAB_0010c6b5:
  pcStack_498 = (code *)0x10c6bc;
  snapshot_after_block_reuse_test();
  goto LAB_0010c6bc;
LAB_0010ca07:
  pcStack_650 = (code *)0x10ca0e;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca0e:
  pcStack_650 = (code *)0x10ca15;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca15:
  pcStack_650 = (code *)0x10ca1c;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca1c:
  pcVar23 = "val";
  pfVar22 = (fdb_config *)0x148599;
  pcStack_650 = (code *)0x10ca23;
  snapshot_inmem_before_block_reuse_test();
  goto LAB_0010ca23;
code_r0x0010cc8c:
  unaff_RBP = unaff_RBP + 0x400;
  if (unaff_RBP == 0xfff) goto code_r0x0010cc9c;
  goto LAB_0010cc33;
code_r0x0010cc9c:
  pcStack_938 = (code *)0x10ccab;
  fVar2 = fdb_get_file_info(pfStack_928,&fStack_8b8);
  aVar25 = aStack_918;
  sVar19 = sStack_920;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d08a;
  handle.seqtree = (btree *)&(aStack_918.seqtree)->vsize;
  sVar7 = (size_t)((int)sStack_920 + 8);
  if (0xffffff < fStack_8b8.file_size) goto code_r0x0010ccd6;
  goto LAB_0010cc24;
LAB_0010d08a:
  pcStack_938 = (code *)0x10d091;
  variable_value_size_test();
LAB_0010d091:
  pcStack_938 = (code *)0x10d098;
  variable_value_size_test();
  aVar26 = handle;
LAB_0010d098:
  handle = aVar26;
  pcStack_938 = (code *)0x10d09f;
  variable_value_size_test();
LAB_0010d09f:
  pcStack_938 = (code *)0x10d0a6;
  variable_value_size_test();
  sVar19 = unaff_RBP;
  aVar25 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar24;
  goto LAB_0010d0a6;
code_r0x0010ccd6:
  pcStack_938 = (code *)0x10ccdf;
  sVar3 = sb_check_block_reusing((fdb_kvs_handle *)aStack_930.seqtree);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010d0ad;
  pcStack_938 = (code *)0x10ccf4;
  fVar2 = fdb_commit(pfStack_928,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b2;
  pcStack_938 = (code *)0x10cd11;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_930.seqtree,
                            (fdb_kvs_handle **)&aStack_900.seqtree,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b9;
  if ((fdb_kvs_handle *)aVar25.seqtree != (fdb_kvs_handle *)0x0) {
    aStack_8f0.seqtree = aVar25.seqtree;
    pcVar23 = (char *)0x0;
    aStack_8e8 = handle;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar25;
      uVar17 = (int)sVar19 + 1;
      pcStack_938 = (code *)0x10cd63;
      sprintf((char *)&fStack_870,"%d_key",(ulong)uVar17);
      sStack_920 = sVar19;
      aStack_918 = aVar25;
      if ((int)uVar17 < 2) {
        uVar13 = 0;
      }
      else {
        uVar13 = sVar19 & 0xffffffff;
        pcStack_938 = (code *)0x10cd85;
        memset(pcVar14,99,uVar13);
      }
      pcVar24 = (char *)aStack_930;
      pcVar14[uVar13] = '\0';
      pfVar22 = &fStack_870;
      pcStack_938 = (code *)0x10cda1;
      sVar6 = strlen((char *)pfVar22);
      unaff_RBP = sVar6 + 1;
      pcStack_938 = (code *)0x10cdad;
      sVar6 = strlen(pcVar14);
      pcStack_938 = (code *)0x10cdc2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar24,pfVar22,unaff_RBP,pcVar14,sVar6 + 1);
      handle = aStack_8e8;
      aVar26 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d098;
      if ((fdb_kvs_handle *)
          (&((fdb_kvs_config *)&(aStack_8e8.seqtree)->ksize)->create_if_missing +
          ~(((ulong)aVar25.seqtree / 5 & 0xfffffffffffffffe) * 5)) == (fdb_kvs_handle *)pcVar23) {
        pcStack_938 = (code *)0x10cdfc;
        fVar2 = fdb_commit(pfStack_928,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d09f;
      }
      aVar25.seqtree = (btree *)((long)&aStack_918.seqtree[-1].aux + 7);
      pcVar23 = (char *)&((btree *)pcVar23)->vsize;
      sVar19 = (size_t)((int)sStack_920 - 8);
    } while (aStack_8f0.seqtree != (btree *)pcVar23);
  }
  pfVar22 = &fStack_870;
  pcStack_938 = (code *)0x10ce31;
  fVar2 = fdb_commit(pfStack_928,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c0;
  aVar25.seqtree = (btree *)&fStack_870;
  pcStack_938 = (code *)0x10ce57;
  sprintf((char *)aVar25.seqtree,"%d_key",0x200);
  pcStack_938 = (code *)0x10ce69;
  memset(pcVar14,0x61,0x4fffff);
  pcVar23 = (char *)aStack_930;
  pcVar14[0x4fffff] = '\0';
  pcStack_938 = (code *)0x10ce7c;
  sVar6 = strlen((char *)aVar25.seqtree);
  pfVar22 = (fdb_config *)(sVar6 + 1);
  pcStack_938 = (code *)0x10ce88;
  sVar6 = strlen(pcVar14);
  pcStack_938 = (code *)0x10ce9d;
  fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar23,aVar25.seqtree,(size_t)pfVar22,pcVar14,sVar6 + 1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c7;
  pcStack_938 = (code *)0x10ceb4;
  fVar2 = fdb_commit(pfStack_928,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ce;
  pcStack_938 = (code *)0x10ceda;
  sprintf((char *)&fStack_870,"%d_key",0x200);
  pcStack_938 = (code *)0x10ceec;
  memset(pcVar14,0x61,0x1ff);
  pcVar23 = (char *)aStack_8f8;
  pcVar14[0x1ff] = '\0';
  pcStack_938 = (code *)0x10cf00;
  sVar6 = strlen((char *)&fStack_870);
  pcStack_938 = (code *)0x10cf19;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar23,(btree *)&fStack_870,sVar6 + 1,&aStack_908.seqtree,
                     (size_t *)&pkStack_910);
  aVar26 = aStack_908;
  aVar25.seqtree = (btree *)&fStack_870;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0d5;
  pcStack_938 = (code *)0x10cf36;
  iVar4 = bcmp(pcVar14,aStack_908.seqtree,(size_t)pkStack_910);
  if (iVar4 != 0) goto LAB_0010d0dc;
  pcStack_938 = (code *)0x10cf46;
  fVar2 = fdb_free_block(aVar26.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e4;
  aVar26.seqtree = (btree *)&fStack_870;
  pcStack_938 = (code *)0x10cf6c;
  sprintf((char *)aVar26.seqtree,"%d_key",0x800);
  pcStack_938 = (code *)0x10cf7e;
  memset(pcVar14,0x62,0x7ff);
  pcVar23 = (char *)aStack_900;
  pcVar14[0x7ff] = '\0';
  pcStack_938 = (code *)0x10cf92;
  sVar6 = strlen((char *)aVar26.seqtree);
  pcStack_938 = (code *)0x10cfab;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar23,aVar26.seqtree,sVar6 + 1,&aStack_908.seqtree,
                     (size_t *)&pkStack_910);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0eb;
  pcStack_938 = (code *)0x10cfc8;
  iVar4 = bcmp(pcVar14,aStack_908.seqtree,(size_t)pkStack_910);
  aVar26 = aStack_908;
  if (iVar4 != 0) goto LAB_0010d0f2;
  pcStack_938 = (code *)0x10cfd8;
  fVar2 = fdb_free_block(aStack_908.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0fa;
  pcStack_938 = (code *)0x10cfe8;
  operator_delete__(pcVar14);
  pcStack_938 = (code *)0x10cff1;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_930.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d101;
  pcStack_938 = (code *)0x10d003;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_8f8.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d108;
  pcStack_938 = (code *)0x10d015;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_900.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d10f;
  pcStack_938 = (code *)0x10d027;
  fVar2 = fdb_close(pfStack_928);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_938 = (code *)0x10d034;
    fdb_shutdown();
    pcStack_938 = (code *)0x10d039;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (variable_value_size_test()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pcStack_938 = (code *)0x10d06a;
    fprintf(_stderr,pcVar23,"variable value size test");
    return;
  }
  goto LAB_0010d116;
LAB_0010d46c:
  pcStack_1010 = (code *)0x10d473;
  rollback_with_num_keeping_headers();
LAB_0010d473:
  pcStack_1010 = (code *)0x10d47a;
  rollback_with_num_keeping_headers();
LAB_0010d47a:
  pcStack_1010 = (code *)0x10d481;
  rollback_with_num_keeping_headers();
  goto LAB_0010d481;
LAB_0010da0f:
  pcStack_14f8 = (code *)0x10da16;
  crash_and_recover_with_num_keeping_test();
LAB_0010da16:
  pcStack_14f8 = (code *)0x10da1d;
  crash_and_recover_with_num_keeping_test();
LAB_0010da1d:
  pcStack_14f8 = (code *)0x10da24;
  crash_and_recover_with_num_keeping_test();
LAB_0010da24:
  pcStack_14f8 = (code *)0x10da2b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da2b:
  pcStack_14f8 = (code *)0x10da32;
  crash_and_recover_with_num_keeping_test();
LAB_0010da32:
  pcStack_14f8 = (code *)0x10da39;
  crash_and_recover_with_num_keeping_test();
LAB_0010da39:
  pcStack_14f8 = (code *)0x10da40;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da40;
LAB_0010de40:
  pfStack_19a0 = (fdb_kvs_handle *)0x10de47;
  reuse_on_delete_test();
LAB_0010de47:
  pfVar9 = pfVar10;
  pfStack_19a0 = (fdb_kvs_handle *)0x10de4e;
  reuse_on_delete_test();
LAB_0010de4e:
  pfStack_19a0 = (fdb_kvs_handle *)0x10de55;
  reuse_on_delete_test();
LAB_0010de55:
  pfStack_19a0 = (fdb_kvs_handle *)0x10de5c;
  reuse_on_delete_test();
  pfVar10 = pfVar9;
  goto LAB_0010de5c;
LAB_0010e2ea:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2f1;
  fragmented_reuse_test();
LAB_0010e2f1:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2f8;
  fragmented_reuse_test();
LAB_0010e2f8:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2ff;
  fragmented_reuse_test();
LAB_0010e2ff:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e306;
  fragmented_reuse_test();
LAB_0010e306:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e30d;
  fragmented_reuse_test();
LAB_0010e30d:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e314;
  fragmented_reuse_test();
  goto LAB_0010e314;
LAB_0010e787:
  pcStackY_2350 = (code *)0x10e78e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e78e:
  pcStackY_2350 = (code *)0x10e795;
  enter_reuse_via_separate_kvs_test();
LAB_0010e795:
  pcStackY_2350 = (code *)0x10e79c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e79c:
  pcStackY_2350 = (code *)0x10e7a1;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e7a1;
}

Assistant:

void snapshot_before_block_reuse_test(bool inmem) {
    memleak_start();
    TEST_INIT();

    int i, j, n, r;
    void *rvalue;
    size_t rvalue_len;
    char bodybuf[256];
    fdb_file_handle* dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fconfig.num_keeping_headers = 1;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "snp";

    // set key
    status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
    TEST_STATUS(status);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // open snapshot
    if (inmem) {
        status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_STATUS(status);
    } else {
        status = fdb_snapshot_open(db, &snap_db, 1);
        TEST_STATUS(status);
    }

    val = "val";

    // initial load to reuse
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // 5 update cycles of created items
    for (n = 0; n < 5; n++) {
        for(j = 0; j < i; j++) {
            status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
            TEST_STATUS(status);
        }
        // commit
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // verify in reclaim mode
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // expect pre-reuse data retained
    status = fdb_get_kv(snap_db, key, strlen(key) + 1, &rvalue, &rvalue_len);
    TEST_STATUS(status);
    TEST_CMP(rvalue, (char *)"snp", rvalue_len);

    // close snapshot
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);

    // do another update cycle
    for (j = 0; j < i; j++) {
        // commit
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // attempt to open again will fail
    status = fdb_snapshot_open(db, &snap_db, 1);
    if (status == FDB_RESULT_SUCCESS) {
        // close incase kv was unexpectedly opened
        status = fdb_kvs_close(snap_db);
        TEST_STATUS(status);
    }
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"snapshot before block reuse test %s", inmem ?
            "in-mem snapshot" : "disk snapshot");
    TEST_RESULT(bodybuf);
}